

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_echocli.cpp
# Opt level: O1

void * readwrite_routine(void *arg)

{
  char *__s1;
  bool bVar1;
  int __fd;
  int iVar2;
  in_addr_t iVar3;
  uint *puVar4;
  stCoEpoll_t *ctx;
  ssize_t sVar5;
  in_addr_t iVar6;
  int error;
  pollfd pf;
  uint32_t socklen;
  sockaddr_in addr;
  char buf [16384];
  uint local_405c;
  pollfd local_4058;
  socklen_t local_404c;
  sockaddr local_4048;
  undefined1 local_4038 [16392];
  
  co_enable_hook_sys();
  __fd = -1;
LAB_00103740:
  do {
    do {
      if (-1 < __fd) break;
      iVar6 = 0;
      __fd = socket(2,1,0);
      __s1 = *arg;
      local_4048.sa_data[6] = '\0';
      local_4048.sa_data[7] = '\0';
      local_4048.sa_data[8] = '\0';
      local_4048.sa_data[9] = '\0';
      local_4048.sa_data[10] = '\0';
      local_4048.sa_data[0xb] = '\0';
      local_4048.sa_data[0xc] = '\0';
      local_4048.sa_data[0xd] = '\0';
      local_4048.sa_data._0_2_ = *(ushort *)((long)arg + 8) << 8 | *(ushort *)((long)arg + 8) >> 8;
      local_4048.sa_family = 2;
      local_4048.sa_data._2_4_ = 0;
      iVar3 = 0;
      if ((__s1 != (char *)0x0) && (iVar3 = iVar6, *__s1 != '\0')) {
        iVar2 = strcmp(__s1,"0");
        if (iVar2 != 0) {
          iVar2 = strcmp(__s1,"0.0.0.0");
          if (iVar2 != 0) {
            iVar2 = strcmp(__s1,"*");
            if (iVar2 != 0) {
              iVar3 = inet_addr(__s1);
            }
          }
        }
      }
      local_4048.sa_data._2_4_ = iVar3;
      connect(__fd,&local_4048,0x10);
      puVar4 = (uint *)__errno_location();
      bVar1 = true;
      if ((*puVar4 & 0xfffffffe) == 0x72) {
        local_4058.events = 0x1c;
        local_4058.fd = __fd;
        local_4058.revents = 0;
        ctx = co_get_epoll_ct();
        co_poll(ctx,&local_4058,1,200);
        local_405c = 0;
        local_404c = 4;
        *puVar4 = 0;
        iVar2 = getsockopt(__fd,1,4,&local_405c,&local_404c);
        if (iVar2 != -1) {
          if (local_405c == 0) {
            bVar1 = true;
            goto LAB_00103886;
          }
          *puVar4 = local_405c;
        }
        close(__fd);
        AddFailCnt();
        __fd = -1;
        bVar1 = false;
      }
LAB_00103886:
    } while (!bVar1);
    sVar5 = write(__fd,"sarlmol",8);
    if (0 < (int)sVar5) {
      sVar5 = read(__fd,local_4038,0x4000);
      if (0 < (int)sVar5) {
        AddSuccCnt();
        goto LAB_00103740;
      }
    }
    close(__fd);
    AddFailCnt();
    __fd = -1;
  } while( true );
}

Assistant:

static void *readwrite_routine( void *arg )
{

	co_enable_hook_sys();

	stEndPoint *endpoint = (stEndPoint *)arg;
	char str[8]="sarlmol";
	char buf[ 1024 * 16 ];
	int fd = -1;
	int ret = 0;
	for(;;)
	{
		if ( fd < 0 )
		{
			fd = socket(PF_INET, SOCK_STREAM, 0);
			struct sockaddr_in addr;
			SetAddr(endpoint->ip, endpoint->port, addr);
			ret = connect(fd,(struct sockaddr*)&addr,sizeof(addr));
						
			if ( errno == EALREADY || errno == EINPROGRESS )
			{       
				struct pollfd pf = { 0 };
				pf.fd = fd;
				pf.events = (POLLOUT|POLLERR|POLLHUP);
				co_poll( co_get_epoll_ct(),&pf,1,200);
				//check connect
				int error = 0;
				uint32_t socklen = sizeof(error);
				errno = 0;
				ret = getsockopt(fd, SOL_SOCKET, SO_ERROR,(void *)&error,  &socklen);
				if ( ret == -1 ) 
				{       
					//printf("getsockopt ERROR ret %d %d:%s\n", ret, errno, strerror(errno));
					close(fd);
					fd = -1;
					AddFailCnt();
					continue;
				}       
				if ( error ) 
				{       
					errno = error;
					//printf("connect ERROR ret %d %d:%s\n", error, errno, strerror(errno));
					close(fd);
					fd = -1;
					AddFailCnt();
					continue;
				}       
			} 
	  			
		}
		
		ret = write( fd,str, 8);
		if ( ret > 0 )
		{
			ret = read( fd,buf, sizeof(buf) );
			if ( ret <= 0 )
			{
				//printf("co %p read ret %d errno %d (%s)\n",
				//		co_self(), ret,errno,strerror(errno));
				close(fd);
				fd = -1;
				AddFailCnt();
			}
			else
			{
				//printf("echo %s fd %d\n", buf,fd);
				AddSuccCnt();
			}
		}
		else
		{
			//printf("co %p write ret %d errno %d (%s)\n",
			//		co_self(), ret,errno,strerror(errno));
			close(fd);
			fd = -1;
			AddFailCnt();
		}
	}
	return 0;
}